

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hh
# Opt level: O2

void __thiscall
kratos::InterfaceRef::InterfaceRef
          (InterfaceRef *this,shared_ptr<kratos::IDefinition> *instance,Generator *gen,string *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (instance->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (instance->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (instance->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (instance->super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (this->vars_)._M_h._M_buckets = &(this->vars_)._M_h._M_single_bucket;
  (this->vars_)._M_h._M_bucket_count = 1;
  (this->vars_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->vars_)._M_h._M_element_count = 0;
  (this->vars_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->vars_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->vars_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ports_)._M_h._M_buckets = &(this->ports_)._M_h._M_single_bucket;
  (this->ports_)._M_h._M_bucket_count = 1;
  (this->ports_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ports_)._M_h._M_element_count = 0;
  (this->ports_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ports_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ports_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->is_port_ = false;
  this->gen_ = gen;
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  this->has_instantiated_ = false;
  (this->mod_ports_)._M_h._M_buckets = &(this->mod_ports_)._M_h._M_single_bucket;
  (this->mod_ports_)._M_h._M_bucket_count = 1;
  (this->mod_ports_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mod_ports_)._M_h._M_element_count = 0;
  (this->mod_ports_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mod_ports_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mod_ports_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->modport_ports_)._M_h._M_buckets = &(this->modport_ports_)._M_h._M_single_bucket;
  (this->modport_ports_)._M_h._M_bucket_count = 1;
  (this->modport_ports_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->modport_ports_)._M_h._M_element_count = 0;
  (this->modport_ports_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->modport_ports_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->modport_ports_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit InterfaceRef(std::shared_ptr<IDefinition> instance, Generator *gen, std::string name)
        : definition_(std::move(instance)), gen_(gen), name_(std::move(name)) {}